

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

HighsTask * __thiscall HighsSplitDeque::steal(HighsSplitDeque *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t *puVar3;
  uint64_t tailSplit;
  reference pvVar4;
  long in_RDI;
  uint32_t s;
  uint32_t t;
  uint64_t ts;
  memory_order __b;
  size_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  memory_order in_stack_fffffffffffffe74;
  atomic<bool> *in_stack_fffffffffffffe78;
  memory_order in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  atomic<bool> *in_stack_fffffffffffffe88;
  uint local_64;
  uint64_t local_60 [3];
  uint64_t local_48;
  memory_order local_40;
  int local_3c;
  uint64_t *local_38;
  undefined1 local_29;
  uint64_t local_28;
  undefined4 local_20;
  undefined4 local_1c;
  uint64_t local_18;
  uint64_t *local_10;
  uint64_t *local_8;
  
  bVar1 = std::atomic<bool>::load(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  if (bVar1) {
    return (HighsTask *)0x0;
  }
  puVar3 = (uint64_t *)(in_RDI + 0x90);
  local_3c = 0;
  local_38 = puVar3;
  local_40 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_3c - 1U < 2) {
    local_48 = *puVar3;
  }
  else if (local_3c == 5) {
    local_48 = *puVar3;
  }
  else {
    local_48 = *puVar3;
  }
  local_60[0] = local_48;
  local_64 = tail(local_48);
  uVar2 = split(local_60[0]);
  if (local_64 < uVar2) {
    puVar3 = (uint64_t *)(in_RDI + 0x90);
    local_28 = makeTailSplit(local_64 + 1,uVar2);
    local_10 = local_60;
    local_1c = 2;
    local_20 = 0;
    LOCK();
    tailSplit = *puVar3;
    local_29 = local_60[0] == tailSplit;
    if ((bool)local_29) {
      *puVar3 = local_28;
      tailSplit = local_60[0];
    }
    UNLOCK();
    local_18 = local_28;
    local_8 = puVar3;
    if ((bool)local_29) {
      pvVar4 = std::array<HighsTask,_8192UL>::operator[]
                         ((array<HighsTask,_8192UL> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe68);
      return pvVar4;
    }
    local_60[0] = tailSplit;
    local_64 = tail(tailSplit);
    uVar2 = split(local_60[0]);
    if (local_64 < uVar2) {
      return (HighsTask *)0x0;
    }
  }
  if ((local_64 < 0x2000) &&
     (bVar1 = std::atomic<bool>::load(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74), !bVar1))
  {
    std::atomic<bool>::store
              (in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87,in_stack_fffffffffffffe80);
  }
  return (HighsTask *)0x0;
}

Assistant:

HighsTask* steal() {
    if (stealerData.allStolen.load(std::memory_order_relaxed)) return nullptr;

    uint64_t ts = stealerData.ts.load(std::memory_order_relaxed);
    uint32_t t = tail(ts);
    uint32_t s = split(ts);
    if (t < s) {
      if (stealerData.ts.compare_exchange_weak(ts, makeTailSplit(t + 1, s),
                                               std::memory_order_acquire,
                                               std::memory_order_relaxed))
        return &taskArray[t];

      t = tail(ts);
      s = split(ts);
      if (t < s) {
        return nullptr;
      }
    }

    if (t < kTaskArraySize && !splitRequest.load(std::memory_order_relaxed))
      splitRequest.store(true, std::memory_order_relaxed);

    return nullptr;
  }